

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::StringPtr&,char>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char *params_1)

{
  StringPtr *value;
  char *value_00;
  char local_31 [1];
  ArrayPtr<const_char> local_30;
  StringPtr *local_20;
  char *params_local_1;
  StringPtr *params_local;
  
  local_20 = params;
  params_local_1 = (char *)this;
  params_local = (StringPtr *)__return_storage_ptr__;
  value = fwd<kj::StringPtr&>((StringPtr *)this);
  local_30 = toCharSequence<kj::StringPtr&>(value);
  value_00 = fwd<char>((NoInfer<char> *)local_20);
  local_31[0] = (char)toCharSequence<char>(value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_30,(ArrayPtr<const_char> *)local_31,
             (FixedArray<char,_1UL> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}